

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_rtree_query_callback
              (sqlite3 *db,char *zQueryFunc,_func_int_sqlite3_rtree_query_info_ptr *xQueryFunc,
              void *pContext,_func_void_void_ptr *xDestructor)

{
  int iVar1;
  undefined8 *p;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    p = (undefined8 *)sqlite3Malloc(0x20);
  }
  else {
    p = (undefined8 *)0x0;
  }
  if (p == (undefined8 *)0x0) {
    if (xDestructor != (_func_void_void_ptr *)0x0) {
      (*xDestructor)(pContext);
    }
    iVar1 = 7;
  }
  else {
    *p = 0;
    p[1] = xQueryFunc;
    p[2] = xDestructor;
    p[3] = pContext;
    iVar1 = createFunctionApi(db,zQueryFunc,-1,5,p,geomCallback,
                              (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                              (_func_void_sqlite3_context_ptr *)0x0,
                              (_func_void_sqlite3_context_ptr *)0x0,
                              (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                              rtreeFreeCallback);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_rtree_query_callback(
  sqlite3 *db,                 /* Register SQL function on this connection */
  const char *zQueryFunc,      /* Name of new SQL function */
  int (*xQueryFunc)(sqlite3_rtree_query_info*), /* Callback */
  void *pContext,              /* Extra data passed into the callback */
  void (*xDestructor)(void*)   /* Destructor for the extra data */
){
  RtreeGeomCallback *pGeomCtx;      /* Context object for new user-function */

  /* Allocate and populate the context object. */
  pGeomCtx = (RtreeGeomCallback *)sqlite3_malloc(sizeof(RtreeGeomCallback));
  if( !pGeomCtx ){
    if( xDestructor ) xDestructor(pContext);
    return SQLITE_NOMEM;
  }
  pGeomCtx->xGeom = 0;
  pGeomCtx->xQueryFunc = xQueryFunc;
  pGeomCtx->xDestructor = xDestructor;
  pGeomCtx->pContext = pContext;
  return sqlite3_create_function_v2(db, zQueryFunc, -1, SQLITE_ANY,
      (void *)pGeomCtx, geomCallback, 0, 0, rtreeFreeCallback
  );
}